

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::
unsetCurrentWrapper(WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream> *this,
                   Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *weakRef)

{
  bool bVar1;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> **ppMVar2;
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_&> local_a8 [2];
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> local_98;
  Fault local_90;
  Fault f;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *local_80;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *local_78;
  undefined1 local_70 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*>
  _kjCondition;
  Fault local_30;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *local_28;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *_kj_result;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *current;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *weakRef_local;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream> *this_local;
  
  current = weakRef;
  weakRef_local = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)this;
  local_28 = kj::_::readMaybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>>
                       (&this->currentWrapper);
  if (local_28 == (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x52c,FAILED,"currentWrapper != nullptr","");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  ppMVar2 = mv<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*>(&local_28);
  local_80 = *ppMVar2;
  _kjCondition._32_8_ = local_80;
  _kj_result = local_80;
  local_78 = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
  f.exception = (Exception *)current;
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*>::operator==
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*>
              *)local_70,
             (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*> *)&local_78,
             (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> **)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*,kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*>&,char_const(&)[63]>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x52e,FAILED,"&current == &weakRef",
               "_kjCondition,\"bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper\"",
               (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*>
                *)local_70,
               (char (*) [63])"bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper");
    kj::_::Debug::Fault::fatal(&local_90);
  }
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>::Maybe(&local_98);
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>::operator=(current,&local_98);
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_&>::Maybe(local_a8);
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_&>::operator=
            (&this->currentWrapper,local_a8);
  return;
}

Assistant:

void unsetCurrentWrapper(kj::Maybe<Subclass&>& weakRef) {
    auto& current = KJ_ASSERT_NONNULL(currentWrapper);
    KJ_ASSERT(&current == &weakRef,
        "bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper");
    weakRef = kj::none;
    currentWrapper = kj::none;
  }